

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::NSSnapValues::ParseTopLevelEvalFunctionBodyInfo
               (TopLevelEvalFunctionBodyResolveInfo *fbInfo,bool readSeparator,
               ThreadContext *threadContext,FileReader *reader,SlabAllocator *alloc)

{
  int iVar1;
  uint64 uVar2;
  SlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  bool readSeparator_local;
  TopLevelEvalFunctionBodyResolveInfo *fbInfo_local;
  
  ParseTopLevelCommonBodyResolveInfo
            (&fbInfo->TopLevelBase,readSeparator,false,threadContext,reader,alloc);
  uVar2 = FileReader::ReadUInt64(reader,u64Val,true);
  fbInfo->EvalFlags = uVar2;
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->RegisterDocument = (bool)((byte)iVar1 & 1);
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->IsIndirect = (bool)((byte)iVar1 & 1);
  iVar1 = (*reader->_vptr_FileReader[10])(reader,10,1);
  fbInfo->IsStrictMode = (bool)((byte)iVar1 & 1);
  (*reader->_vptr_FileReader[7])();
  return;
}

Assistant:

void ParseTopLevelEvalFunctionBodyInfo(TopLevelEvalFunctionBodyResolveInfo* fbInfo, bool readSeparator, ThreadContext* threadContext, FileReader* reader, SlabAllocator& alloc)
        {
            NSSnapValues::ParseTopLevelCommonBodyResolveInfo(&fbInfo->TopLevelBase, readSeparator, false, threadContext, reader, alloc);

            fbInfo->EvalFlags = reader->ReadUInt64(NSTokens::Key::u64Val, true);
            fbInfo->RegisterDocument = reader->ReadBool(NSTokens::Key::boolVal, true);
            fbInfo->IsIndirect = reader->ReadBool(NSTokens::Key::boolVal, true);
            fbInfo->IsStrictMode = reader->ReadBool(NSTokens::Key::boolVal, true);
            reader->ReadRecordEnd();
        }